

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::StyleSheet>::moveAppend
          (QGenericArrayOps<QCss::StyleSheet> *this,StyleSheet *b,StyleSheet *e)

{
  qsizetype *pqVar1;
  StyleSheet *pSVar2;
  long lVar3;
  Data *pDVar4;
  StyleRule *pSVar5;
  qsizetype qVar6;
  Data *pDVar7;
  MediaRule *pMVar8;
  Data *pDVar9;
  PageRule *pPVar10;
  Data *pDVar11;
  AnimationRule *pAVar12;
  Data *pDVar13;
  ImportRule *pIVar14;
  Data *pDVar15;
  int iVar16;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<QCss::StyleSheet>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::StyleSheet>).size;
      pDVar4 = (b->styleRules).d.d;
      (b->styleRules).d.d = (Data *)0x0;
      pSVar2[lVar3].styleRules.d.d = pDVar4;
      pSVar5 = (b->styleRules).d.ptr;
      (b->styleRules).d.ptr = (StyleRule *)0x0;
      pSVar2[lVar3].styleRules.d.ptr = pSVar5;
      qVar6 = (b->styleRules).d.size;
      (b->styleRules).d.size = 0;
      pSVar2[lVar3].styleRules.d.size = qVar6;
      pDVar7 = (b->mediaRules).d.d;
      (b->mediaRules).d.d = (Data *)0x0;
      pSVar2[lVar3].mediaRules.d.d = pDVar7;
      pMVar8 = (b->mediaRules).d.ptr;
      (b->mediaRules).d.ptr = (MediaRule *)0x0;
      pSVar2[lVar3].mediaRules.d.ptr = pMVar8;
      qVar6 = (b->mediaRules).d.size;
      (b->mediaRules).d.size = 0;
      pSVar2[lVar3].mediaRules.d.size = qVar6;
      pDVar9 = (b->pageRules).d.d;
      (b->pageRules).d.d = (Data *)0x0;
      pSVar2[lVar3].pageRules.d.d = pDVar9;
      pPVar10 = (b->pageRules).d.ptr;
      (b->pageRules).d.ptr = (PageRule *)0x0;
      pSVar2[lVar3].pageRules.d.ptr = pPVar10;
      qVar6 = (b->pageRules).d.size;
      (b->pageRules).d.size = 0;
      pSVar2[lVar3].pageRules.d.size = qVar6;
      pDVar11 = (b->animationRules).d.d;
      (b->animationRules).d.d = (Data *)0x0;
      pSVar2[lVar3].animationRules.d.d = pDVar11;
      pAVar12 = (b->animationRules).d.ptr;
      (b->animationRules).d.ptr = (AnimationRule *)0x0;
      pSVar2[lVar3].animationRules.d.ptr = pAVar12;
      qVar6 = (b->animationRules).d.size;
      (b->animationRules).d.size = 0;
      pSVar2[lVar3].animationRules.d.size = qVar6;
      pDVar13 = (b->importRules).d.d;
      (b->importRules).d.d = (Data *)0x0;
      pSVar2[lVar3].importRules.d.d = pDVar13;
      pIVar14 = (b->importRules).d.ptr;
      (b->importRules).d.ptr = (ImportRule *)0x0;
      pSVar2[lVar3].importRules.d.ptr = pIVar14;
      qVar6 = (b->importRules).d.size;
      (b->importRules).d.size = 0;
      pSVar2[lVar3].importRules.d.size = qVar6;
      iVar16 = b->depth;
      pSVar2[lVar3].origin = b->origin;
      pSVar2[lVar3].depth = iVar16;
      pDVar15 = (b->nameIndex).d;
      (b->nameIndex).d = (Data *)0x0;
      pSVar2[lVar3].nameIndex.d = pDVar15;
      qVar6 = (b->nameIndex).m_size;
      (b->nameIndex).m_size = 0;
      pSVar2[lVar3].nameIndex.m_size = qVar6;
      pDVar15 = (b->idIndex).d;
      (b->idIndex).d = (Data *)0x0;
      pSVar2[lVar3].idIndex.d = pDVar15;
      qVar6 = (b->idIndex).m_size;
      (b->idIndex).m_size = 0;
      pSVar2[lVar3].idIndex.m_size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::StyleSheet>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }